

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O3

void * mi_heap_calloc(mi_heap_t *heap,size_t count,size_t size)

{
  long lVar1;
  undefined8 *__s;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void *adst;
  void *pvVar4;
  
  if ((count != 1) &&
     (auVar2._8_8_ = 0, auVar2._0_8_ = count, auVar3._8_8_ = 0, auVar3._0_8_ = size,
     size = SUB168(auVar2 * auVar3,0), SUB168(auVar2 * auVar3,8) != 0)) {
    return (void *)0x0;
  }
  if (size < 0x401) {
    lVar1 = *(long *)((long)heap->pages_free_direct + (size + 7 & 0xfffffffffffffff8));
    __s = *(undefined8 **)(lVar1 + 0x10);
    if (__s != (undefined8 *)0x0) {
      *(undefined8 *)(lVar1 + 0x10) = *__s;
      *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
      if ((*(byte *)(lVar1 + 0xf) & 1) != 0) {
        *__s = 0;
        return __s;
      }
      pvVar4 = memset(__s,0,*(size_t *)(lVar1 + 0x28));
      return pvVar4;
    }
  }
  pvVar4 = _mi_malloc_generic(heap,size,true,0);
  return pvVar4;
}

Assistant:

static inline bool mi_count_size_overflow(size_t count, size_t size, size_t* total) {
  if (count==1) {  // quick check for the case where count is one (common for C++ allocators)
    *total = size;
    return false;
  }
  else if mi_unlikely(mi_mul_overflow(count, size, total)) {
    #if MI_DEBUG > 0
    _mi_error_message(EOVERFLOW, "allocation request is too large (%zu * %zu bytes)\n", count, size);
    #endif
    *total = SIZE_MAX;
    return true;
  }
  else return false;
}